

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

TVMArgValue __thiscall tvm::runtime::TVMArgs::operator[](TVMArgs *this,int i)

{
  ostream *poVar1;
  TVMArgValue TVar2;
  LogCheckError _check_err;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  LogMessageFatal local_1a0;
  
  dmlc::LogCheck_LT(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
  if (CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58) != 0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
               ,0x408);
    poVar1 = std::operator<<((ostream *)&local_1a0,"Check failed: ");
    poVar1 = std::operator<<(poVar1,"i < num_args");
    poVar1 = std::operator<<(poVar1,(string *)
                                    CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,"not enough argument passed, ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->num_args);
    poVar1 = std::operator<<(poVar1," passed");
    poVar1 = std::operator<<(poVar1," but request arg[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
    std::operator<<(poVar1,"].");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  dmlc::LogCheckError::~LogCheckError((LogCheckError *)&stack0xfffffffffffffe58);
  TVar2.super_TVMPODValue_.type_code_ = this->type_codes[i];
  TVar2.super_TVMPODValue_.value_.v_int64 = this->values[i].v_int64;
  TVar2.super_TVMPODValue_._12_4_ = 0;
  return (TVMArgValue)TVar2.super_TVMPODValue_;
}

Assistant:

inline TVMArgValue TVMArgs::operator[](int i) const {
  CHECK_LT(i, num_args)
      << "not enough argument passed, "
      << num_args << " passed"
      << " but request arg[" << i << "].";
  return TVMArgValue(values[i], type_codes[i]);
}